

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::Attribute::get_value<tinyusdz::value::quath>(Attribute *this,quath *v)

{
  value_type *pvVar1;
  optional<tinyusdz::value::quath> local_34;
  undefined1 local_2a [8];
  optional<tinyusdz::value::quath> ret;
  quath *v_local;
  Attribute *this_local;
  
  if (v == (quath *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained = (storage_t<tinyusdz::value::quath>)v;
    primvar::PrimVar::get_value<tinyusdz::value::quath>(&local_34,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::quath>::optional<tinyusdz::value::quath,_0>
              ((optional<tinyusdz::value::quath> *)local_2a,&local_34);
    nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional(&local_34);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_2a);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<tinyusdz::value::quath>::value
                         ((optional<tinyusdz::value::quath> *)local_2a);
      *(value_type *)ret.contained = *pvVar1;
    }
    nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional
              ((optional<tinyusdz::value::quath> *)local_2a);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }